

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

void pstore::database::build_new_store(file_base *file)

{
  bool bVar1;
  typed_address<pstore::trailer> __i;
  value_type absolute;
  iterator __first;
  iterator __last;
  uint64_t __i_00;
  long lVar2;
  ulong uVar3;
  index_records_array *local_f0;
  typed_address<pstore::index::header_block> local_e8;
  undefined1 local_e0 [8];
  trailer t;
  typed_address<pstore::trailer> local_68;
  undefined1 local_60 [8];
  lock_block lb;
  undefined1 local_40 [8];
  header header;
  file_base *file_local;
  
  header.footer_pos._M_i.a_.a_ =
       (typed_address<pstore::trailer>)(typed_address<pstore::trailer>)file;
  (*file->_vptr_file_base[6])(file,0);
  pstore::header::header((header *)local_40);
  __i = typed_address<pstore::trailer>::make(0x40);
  lb.transaction_lock =
       (uint64_t)
       std::atomic<pstore::typed_address<pstore::trailer>_>::operator=
                 ((atomic<pstore::typed_address<pstore::trailer>_> *)&header.crc,__i);
  pstore::file::file_base::write<pstore::header,void>
            ((file_base *)header.footer_pos._M_i.a_.a_,(header *)local_40);
  local_60 = (undefined1  [8])lock_block::chars_to_uint64('V','a','c','u','u','m','L','k');
  lb.vacuum_lock = lock_block::chars_to_uint64('T','r','n','s','a','c','t','L');
  pstore::file::file_base::write<pstore::lock_block,void>
            ((file_base *)header.footer_pos._M_i.a_.a_,(lock_block *)local_60);
  local_68 = std::atomic<pstore::typed_address<pstore::trailer>_>::load
                       ((atomic<pstore::typed_address<pstore::trailer>_> *)&header.crc,
                        memory_order_seq_cst);
  absolute = (**(code **)(*(long *)header.footer_pos._M_i.a_.a_ + 0x38))();
  t.signature2._M_elems = (_Type)typed_address<pstore::trailer>::make(absolute);
  bVar1 = typed_address<pstore::trailer>::operator==
                    (&local_68,(typed_address<pstore::trailer> *)&t.signature2);
  if (!bVar1) {
    assert_failed("header.footer_pos.load () == typed_address<trailer>::make (file.tell ())",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp"
                  ,0xea);
  }
  local_e0[0] = 'h';
  local_e0[1] = 'P';
  local_e0[2] = 'P';
  local_e0[3] = 'y';
  local_e0[4] = 'f';
  local_e0[5] = 'o';
  local_e0[6] = 'o';
  local_e0[7] = 'T';
  std::atomic<unsigned_int>::atomic((atomic<unsigned_int> *)&t,0);
  t.a.signature1._M_elems[4] = '\0';
  t.a.signature1._M_elems[5] = '\0';
  t.a.signature1._M_elems[6] = '\0';
  t.a.signature1._M_elems[7] = '\0';
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)&t.a.generation,0);
  std::atomic<unsigned_long>::atomic(&t.a.size,0);
  t.a.time.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)typed_address<pstore::trailer>::null();
  local_f0 = (index_records_array *)&t.a.prev_generation;
  memset(local_f0,0,0x30);
  do {
    typed_address<pstore::index::header_block>::typed_address(local_f0->_M_elems);
    local_f0 = (index_records_array *)(local_f0->_M_elems + 1);
  } while (local_f0 != (index_records_array *)(t.a.index_records._M_elems + 5));
  t.a.index_records._M_elems[5].a_.a_._0_4_ = 0;
  t.a.index_records._M_elems[5].a_.a_._4_4_ = 0;
  t.a.unused2 = 0;
  t.a.unused3 = 0;
  t.crc = 0x79505068;
  t.unused1 = 0x6c696154;
  __first = std::begin<std::array<pstore::typed_address<pstore::index::header_block>,6ul>>
                      ((array<pstore::typed_address<pstore::index::header_block>,_6UL> *)
                       &t.a.prev_generation);
  __last = std::end<std::array<pstore::typed_address<pstore::index::header_block>,6ul>>
                     ((array<pstore::typed_address<pstore::index::header_block>,_6UL> *)
                      &t.a.prev_generation);
  local_e8 = typed_address<pstore::index::header_block>::null();
  std::
  fill<pstore::typed_address<pstore::index::header_block>*,pstore::typed_address<pstore::index::header_block>>
            (__first,__last,&local_e8);
  __i_00 = milliseconds_since_epoch();
  std::__atomic_base<unsigned_long>::operator=(&t.a.size.super___atomic_base<unsigned_long>,__i_00);
  t.a.unused2 = trailer::get_crc((trailer *)local_e0);
  pstore::file::file_base::write<pstore::trailer,void>
            ((file_base *)header.footer_pos._M_i.a_.a_,(trailer *)local_e0);
  lVar2 = (**(code **)(*(long *)header.footer_pos._M_i.a_.a_ + 0x48))();
  if (lVar2 == 0xb0) {
    uVar3 = (**(code **)(*(long *)header.footer_pos._M_i.a_.a_ + 0x48))();
    if (uVar3 < 0x400000) {
      (**(code **)(*(long *)header.footer_pos._M_i.a_.a_ + 0x50))
                (header.footer_pos._M_i.a_.a_,0x400000);
    }
    return;
  }
  assert_failed("file.size () == leader_size + sizeof (trailer)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp"
                ,0xf5);
}

Assistant:

void database::build_new_store (file::file_base & file) {
        // Write the inital header, lock block, and footer to the file.
        {
            file.seek (0);

            header header{};
            header.footer_pos = typed_address<trailer>::make (leader_size);
            file.write (header);

            lock_block const lb{};
            file.write (lb);

            PSTORE_ASSERT (header.footer_pos.load () ==
                           typed_address<trailer>::make (file.tell ()));

            trailer t{};
            std::fill (std::begin (t.a.index_records), std::end (t.a.index_records),
                       typed_address<index::header_block>::null ());
            t.a.time = milliseconds_since_epoch ();
            t.crc = t.get_crc ();
            file.write (t);
        }
        // Make sure that the file is at least large enough for the minimum region size.
        {
            PSTORE_ASSERT (file.size () == leader_size + sizeof (trailer));
            // TODO: ask the region factory what the min region size is.
            if (file.size () < storage::min_region_size && !database::small_files_enabled ()) {
                file.truncate (storage::min_region_size);
            }
        }
    }